

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O1

Aig_Man_t * Saig_ManCreateMiterComb(Aig_Man_t *p0,Aig_Man_t *p1,int Oper)

{
  void *pvVar1;
  Aig_Man_t *p;
  char *pcVar2;
  Aig_Obj_t *pAVar3;
  ulong uVar4;
  Vec_Ptr_t *pVVar5;
  ulong uVar6;
  Aig_Obj_t *pAVar7;
  long lVar8;
  
  if (p0->nObjs[2] != p1->nObjs[2]) {
    __assert_fail("Aig_ManCiNum(p0) == Aig_ManCiNum(p1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigMiter.c"
                  ,0xa8,"Aig_Man_t *Saig_ManCreateMiterComb(Aig_Man_t *, Aig_Man_t *, int)");
  }
  if (p0->nObjs[3] != p1->nObjs[3]) {
    __assert_fail("Aig_ManCoNum(p0) == Aig_ManCoNum(p1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigMiter.c"
                  ,0xa9,"Aig_Man_t *Saig_ManCreateMiterComb(Aig_Man_t *, Aig_Man_t *, int)");
  }
  p = Aig_ManStart(p1->vObjs->nSize + p0->vObjs->nSize);
  pcVar2 = (char *)malloc(6);
  builtin_strncpy(pcVar2,"miter",6);
  p->pName = pcVar2;
  p0->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  p1->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  pVVar5 = p0->vCis;
  if (0 < pVVar5->nSize) {
    lVar8 = 0;
    do {
      pvVar1 = pVVar5->pArray[lVar8];
      pAVar3 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar3;
      lVar8 = lVar8 + 1;
      pVVar5 = p0->vCis;
    } while (lVar8 < pVVar5->nSize);
  }
  pVVar5 = p1->vCis;
  if (0 < pVVar5->nSize) {
    lVar8 = 0;
    do {
      if (p->vCis->nSize <= lVar8) goto LAB_006e7033;
      *(void **)((long)pVVar5->pArray[lVar8] + 0x28) = p->vCis->pArray[lVar8];
      lVar8 = lVar8 + 1;
      pVVar5 = p1->vCis;
    } while (lVar8 < pVVar5->nSize);
  }
  pVVar5 = p0->vObjs;
  if (0 < pVVar5->nSize) {
    lVar8 = 0;
    do {
      pvVar1 = pVVar5->pArray[lVar8];
      if ((pvVar1 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7)) {
        if (((ulong)pvVar1 & 1) != 0) goto LAB_006e7014;
        uVar4 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
        if (uVar4 == 0) {
          pAVar3 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar3 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar4 + 0x28));
        }
        uVar4 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
        if (uVar4 == 0) {
          pAVar7 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar7 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^ *(ulong *)(uVar4 + 0x28));
        }
        pAVar3 = Aig_And(p,pAVar3,pAVar7);
        *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar3;
      }
      lVar8 = lVar8 + 1;
      pVVar5 = p0->vObjs;
    } while (lVar8 < pVVar5->nSize);
  }
  pVVar5 = p1->vObjs;
  if (0 < pVVar5->nSize) {
    lVar8 = 0;
    do {
      pvVar1 = pVVar5->pArray[lVar8];
      if ((pvVar1 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7)) {
        if (((ulong)pvVar1 & 1) != 0) goto LAB_006e7014;
        uVar4 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
        if (uVar4 == 0) {
          pAVar3 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar3 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar4 + 0x28));
        }
        uVar4 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
        if (uVar4 == 0) {
          pAVar7 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar7 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^ *(ulong *)(uVar4 + 0x28));
        }
        pAVar3 = Aig_And(p,pAVar3,pAVar7);
        *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar3;
      }
      lVar8 = lVar8 + 1;
      pVVar5 = p1->vObjs;
    } while (lVar8 < pVVar5->nSize);
  }
  pVVar5 = p0->vCos;
  if (0 < pVVar5->nSize) {
    if (1 < (uint)Oper) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigMiter.c"
                    ,0xc1,"Aig_Man_t *Saig_ManCreateMiterComb(Aig_Man_t *, Aig_Man_t *, int)");
    }
    lVar8 = 0;
    do {
      pvVar1 = pVVar5->pArray[lVar8];
      if (Oper == 0) {
        if (((ulong)pvVar1 & 1) != 0) {
LAB_006e7014:
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                        ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
        }
        uVar4 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
        if (uVar4 == 0) {
          pAVar3 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar3 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar4 + 0x28));
        }
        if (p1->vCos->nSize <= lVar8) {
LAB_006e7033:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar1 = p1->vCos->pArray[lVar8];
        if (((ulong)pvVar1 & 1) != 0) goto LAB_006e7014;
        uVar4 = *(ulong *)((long)pvVar1 + 8);
        uVar6 = uVar4 & 0xfffffffffffffffe;
        if (uVar6 == 0) {
          pAVar7 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar7 = (Aig_Obj_t *)((ulong)((uint)uVar4 & 1) ^ *(ulong *)(uVar6 + 0x28));
        }
        pAVar3 = Aig_Exor(p,pAVar3,pAVar7);
      }
      else {
        if (((ulong)pvVar1 & 1) != 0) goto LAB_006e7014;
        uVar4 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
        if (uVar4 == 0) {
          pAVar3 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar3 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar4 + 0x28));
        }
        if (p1->vCos->nSize <= lVar8) goto LAB_006e7033;
        pvVar1 = p1->vCos->pArray[lVar8];
        if (((ulong)pvVar1 & 1) != 0) goto LAB_006e7014;
        uVar4 = *(ulong *)((long)pvVar1 + 8);
        uVar6 = uVar4 & 0xfffffffffffffffe;
        if (uVar6 == 0) {
          pAVar7 = (Aig_Obj_t *)0x1;
        }
        else {
          pAVar7 = (Aig_Obj_t *)((ulong)((uint)uVar4 & 1) ^ *(ulong *)(uVar6 + 0x28) ^ 1);
        }
        pAVar3 = Aig_And(p,pAVar3,pAVar7);
      }
      Aig_ObjCreateCo(p,pAVar3);
      lVar8 = lVar8 + 1;
      pVVar5 = p0->vCos;
    } while (lVar8 < pVVar5->nSize);
  }
  Aig_ManSetRegNum(p,0);
  Aig_ManCleanup(p);
  return p;
}

Assistant:

Aig_Man_t * Saig_ManCreateMiterComb( Aig_Man_t * p0, Aig_Man_t * p1, int Oper )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    assert( Aig_ManCiNum(p0) == Aig_ManCiNum(p1) );
    assert( Aig_ManCoNum(p0) == Aig_ManCoNum(p1) );
    pNew = Aig_ManStart( Aig_ManObjNumMax(p0) + Aig_ManObjNumMax(p1) );
    pNew->pName = Abc_UtilStrsav( "miter" );
    // map constant nodes
    Aig_ManConst1(p0)->pData = Aig_ManConst1(pNew);
    Aig_ManConst1(p1)->pData = Aig_ManConst1(pNew);
    // map primary inputs and register outputs
    Aig_ManForEachCi( p0, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    Aig_ManForEachCi( p1, pObj, i )
        pObj->pData = Aig_ManCi( pNew, i );
    // map internal nodes
    Aig_ManForEachNode( p0, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    Aig_ManForEachNode( p1, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // create primary outputs
    Aig_ManForEachCo( p0, pObj, i )
    {
        if ( Oper == 0 ) // XOR
            pObj = Aig_Exor( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild0Copy(Aig_ManCo(p1,i)) );
        else if ( Oper == 1 ) // implication is PO(p0) -> PO(p1)  ...  complement is PO(p0) & !PO(p1) 
            pObj = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_Not(Aig_ObjChild0Copy(Aig_ManCo(p1,i))) );
        else
            assert( 0 );
        Aig_ObjCreateCo( pNew, pObj );
    }
    // cleanup
    Aig_ManSetRegNum( pNew, 0 );
    Aig_ManCleanup( pNew );
    return pNew;
}